

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::
Cloner<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
::operator()(Cloner<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
             *this,Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *s,
            Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *t)

{
  long *plVar1;
  Node *pNVar2;
  Node *pNVar3;
  long lVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  
  uVar6 = t->mMask + 1;
  if (uVar6 < 0x28f5c28f5c28f5d) {
    uVar7 = (uVar6 * 0x50) / 100;
  }
  else {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar6 >> 2;
    uVar7 = (SUB168(auVar5 * ZEXT816(0x28f5c28f5c28f5c3),8) & 0x3ffffffffffffffc) * 0x14;
  }
  uVar11 = 0xff;
  if (uVar7 < 0xff) {
    uVar11 = uVar7;
  }
  lVar10 = uVar11 + uVar6;
  if (lVar10 + 8U != 0) {
    memmove(t->mInfo,s->mInfo,lVar10 + 8U);
  }
  if (lVar10 != 0) {
    lVar8 = 0;
    lVar9 = 0;
    do {
      if (t->mInfo[lVar9] != '\0') {
        pNVar2 = t->mKeyVals;
        pNVar3 = s->mKeyVals;
        plVar1 = (long *)((long)&(pNVar2->mData).first._M_dataplus._M_p + lVar8);
        *plVar1 = (long)(plVar1 + 2);
        lVar4 = *(long *)((long)&(pNVar3->mData).first._M_dataplus._M_p + lVar8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)((long)&(pNVar2->mData).first._M_dataplus._M_p + lVar8),lVar4,
                   *(long *)((long)&(pNVar3->mData).first._M_string_length + lVar8) + lVar4);
        *(undefined4 *)(plVar1 + 4) = *(undefined4 *)((long)&(pNVar3->mData).second + lVar8);
      }
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 0x28;
    } while (lVar10 != lVar9);
  }
  return;
}

Assistant:

void operator()(M const& s, M& t) const {
            auto const numElementsWithBuffer = t.calcNumElementsWithBuffer(t.mMask + 1);
            std::copy(s.mInfo, s.mInfo + t.calcNumBytesInfo(numElementsWithBuffer), t.mInfo);

            for (size_t i = 0; i < numElementsWithBuffer; ++i) {
                if (t.mInfo[i]) {
                    ::new (static_cast<void*>(t.mKeyVals + i)) Node(t, *s.mKeyVals[i]);
                }
            }
        }